

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rprog.c
# Opt level: O2

bool rprog_unset(ROOM_INDEX_DATA *room,char *progtype,char *name)

{
  long lVar1;
  RPROG_DATA *pRVar2;
  bool bVar3;
  char **ppcVar4;
  long lVar5;
  ulong uStack_30;
  
  lVar5 = 8;
  do {
    lVar1 = lVar5 + 0x20;
    if (lVar1 == 0x248) goto LAB_0034e297;
    bVar3 = str_cmp(*(char **)((long)&rprog_table[0].type + lVar5),name);
    lVar5 = lVar1;
  } while (bVar3);
  bVar3 = str_cmp(progtype,"pulse_prog");
  if (bVar3) {
    bVar3 = str_cmp(progtype,"entry_prog");
    if (bVar3) {
      bVar3 = str_cmp(progtype,"move_prog");
      if (bVar3) {
        bVar3 = str_cmp(progtype,"drop_prog");
        if (bVar3) {
          bVar3 = str_cmp(progtype,"speech_prog");
          if (bVar3) {
            bVar3 = str_cmp(progtype,"open_prog");
            if (bVar3) goto LAB_0034e297;
            pRVar2 = room->rprogs;
            pRVar2->open_prog = (RPROG_FUN_OPEN *)0x0;
            ppcVar4 = &pRVar2->open_name;
            uStack_30 = 0xffffffffffffffdf;
          }
          else {
            pRVar2 = room->rprogs;
            pRVar2->speech_prog = (RPROG_FUN_SPEECH *)0x0;
            ppcVar4 = &pRVar2->speech_name;
            uStack_30 = 0xffffffffffffffef;
          }
        }
        else {
          pRVar2 = room->rprogs;
          pRVar2->drop_prog = (RPROG_FUN_DROP *)0x0;
          ppcVar4 = &pRVar2->drop_name;
          uStack_30 = 0xfffffffffffffff7;
        }
      }
      else {
        pRVar2 = room->rprogs;
        pRVar2->move_prog = (RPROG_FUN_MOVE *)0x0;
        ppcVar4 = &pRVar2->move_name;
        uStack_30 = 0xfffffffffffffffb;
      }
    }
    else {
      pRVar2 = room->rprogs;
      pRVar2->entry_prog = (RPROG_FUN_ENTRY *)0x0;
      ppcVar4 = &pRVar2->entry_name;
      uStack_30 = 0xfffffffffffffffd;
    }
  }
  else {
    pRVar2 = room->rprogs;
    pRVar2->pulse_prog = (RPROG_FUN_PULSE *)0x0;
    ppcVar4 = &pRVar2->pulse_name;
    uStack_30 = 0xfffffffffffffffe;
  }
  free_pstring(*ppcVar4);
  room->progtypes[0] = room->progtypes[0] & uStack_30;
LAB_0034e297:
  return lVar1 != 0x248;
}

Assistant:

bool rprog_unset(ROOM_INDEX_DATA *room, const char *progtype, const char *name)
{
	int i;
	for (i = 0; rprog_table[i].name; i++)
	{
		if (!str_cmp(rprog_table[i].name, name))
			break;
	}

	if (!rprog_table[i].name)
		return false;

	// IF YOU ADD A NEW TYPE ALSO PUT IT IN DB.C DO_ADUMP
	if (!str_cmp(progtype, "pulse_prog"))
	{
		room->rprogs->pulse_prog = nullptr;
		free_pstring(room->rprogs->pulse_name);
		REMOVE_BIT(room->progtypes, RPROG_PULSE);
	}
	else if (!str_cmp(progtype, "entry_prog"))
	{
		room->rprogs->entry_prog = nullptr;
		free_pstring(room->rprogs->entry_name);
		REMOVE_BIT(room->progtypes, RPROG_ENTRY);
	}
	else if (!str_cmp(progtype, "move_prog"))
	{
		room->rprogs->move_prog = nullptr;
		free_pstring(room->rprogs->move_name);
		REMOVE_BIT(room->progtypes, RPROG_MOVE);
	}
	else if (!str_cmp(progtype, "drop_prog"))
	{
		room->rprogs->drop_prog = nullptr;
		free_pstring(room->rprogs->drop_name);
		REMOVE_BIT(room->progtypes, RPROG_DROP);
	}
	else if (!str_cmp(progtype, "speech_prog"))
	{
		room->rprogs->speech_prog = nullptr;
		free_pstring(room->rprogs->speech_name);
		REMOVE_BIT(room->progtypes, RPROG_SPEECH);
	}
	else if (!str_cmp(progtype, "open_prog"))
	{
		room->rprogs->open_prog = nullptr;
		free_pstring(room->rprogs->open_name);
		REMOVE_BIT(room->progtypes, RPROG_OPEN);
	}

	return true;
}